

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_line_element.hpp
# Opt level: O0

void __thiscall UrlLineElement::~UrlLineElement(UrlLineElement *this)

{
  UrlLineElement *this_local;
  
  ~UrlLineElement(this);
  operator_delete(this,0x48);
  return;
}

Assistant:

~UrlLineElement() {}